

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

LY_ERR eval_absolute_location_path(lyxp_expr *exp,uint32_t *tok_idx,lyxp_set *set,uint32_t options)

{
  lyxp_token lVar1;
  LY_ERR LVar2;
  char *pcVar3;
  char *pcVar4;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_bool all_desc;
  uint32_t options_local;
  lyxp_set *set_local;
  uint32_t *tok_idx_local;
  lyxp_expr *exp_local;
  
  if (((options & 0x20) == 0) && (LVar2 = moveto_root(set,options), LVar2 != LY_SUCCESS)) {
    return LVar2;
  }
  if (exp->tok_len[*tok_idx] == 1) {
    pcVar3 = "parsed";
    if ((options & 0x20) != 0) {
      pcVar3 = "skipped";
    }
    pcVar4 = lyxp_token2str(exp->tokens[*tok_idx]);
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_absolute_location_path",pcVar3,pcVar4,
               (ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
    LVar2 = lyxp_check_token((ly_ctx *)0x0,exp,*tok_idx,LYXP_TOKEN_NONE);
    if (LVar2 != LY_SUCCESS) {
      return LY_SUCCESS;
    }
    lVar1 = exp->tokens[*tok_idx];
    if (((2 < lVar1 - LYXP_TOKEN_DOT) && (1 < lVar1 - LYXP_TOKEN_NAMETEST)) &&
       (lVar1 != LYXP_TOKEN_AXISNAME)) {
      return LY_SUCCESS;
    }
    LVar2 = eval_relative_location_path(exp,tok_idx,'\0',set,options);
  }
  else {
    pcVar3 = "parsed";
    if ((options & 0x20) != 0) {
      pcVar3 = "skipped";
    }
    pcVar4 = lyxp_token2str(exp->tokens[*tok_idx]);
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_absolute_location_path",pcVar3,pcVar4,
               (ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
    LVar2 = eval_relative_location_path(exp,tok_idx,'\x01',set,options);
  }
  if (LVar2 == LY_SUCCESS) {
    return LY_SUCCESS;
  }
  return LVar2;
}

Assistant:

static LY_ERR
eval_absolute_location_path(const struct lyxp_expr *exp, uint32_t *tok_idx, struct lyxp_set *set, uint32_t options)
{
    ly_bool all_desc;

    if (!(options & LYXP_SKIP_EXPR)) {
        /* no matter what tokens follow, we need to be at the root */
        LY_CHECK_RET(moveto_root(set, options));
    }

    /* '/' RelativeLocationPath? */
    if (exp->tok_len[*tok_idx] == 1) {
        /* evaluate '/' - deferred */
        all_desc = 0;
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

        if (lyxp_check_token(NULL, exp, *tok_idx, LYXP_TOKEN_NONE)) {
            return LY_SUCCESS;
        }
        switch (exp->tokens[*tok_idx]) {
        case LYXP_TOKEN_DOT:
        case LYXP_TOKEN_DDOT:
        case LYXP_TOKEN_AXISNAME:
        case LYXP_TOKEN_AT:
        case LYXP_TOKEN_NAMETEST:
        case LYXP_TOKEN_NODETYPE:
            LY_CHECK_RET(eval_relative_location_path(exp, tok_idx, all_desc, set, options));
            break;
        default:
            break;
        }

    } else {
        /* '//' RelativeLocationPath */
        /* evaluate '//' - deferred so as not to waste memory by remembering all the nodes */
        all_desc = 1;
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (options & LYXP_SKIP_EXPR ? "skipped" : "parsed"),
                lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
        ++(*tok_idx);

        LY_CHECK_RET(eval_relative_location_path(exp, tok_idx, all_desc, set, options));
    }

    return LY_SUCCESS;
}